

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

Proto * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,char *name)

{
  size_t l;
  TString *source;
  LexState lexstate;
  FuncState funcstate;
  LexState LStack_2d8;
  FuncState local_278;
  
  LStack_2d8.buff = buff;
  l = strlen(name);
  source = luaS_newlstr(L,name,l);
  luaX_setinput(L,&LStack_2d8,z,source);
  open_func(&LStack_2d8,&local_278);
  (local_278.f)->is_vararg = '\x02';
  luaX_next(&LStack_2d8);
  chunk(&LStack_2d8);
  if (LStack_2d8.t.token != 0x11f) {
    error_expected(&LStack_2d8,0x11f);
  }
  close_func(&LStack_2d8);
  return local_278.f;
}

Assistant:

Proto *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff, const char *name) {
  struct LexState lexstate;
  struct FuncState funcstate;
  lexstate.buff = buff;
  luaX_setinput(L, &lexstate, z, luaS_new(L, name));
  open_func(&lexstate, &funcstate);
  funcstate.f->is_vararg = VARARG_ISVARARG;  /* main func. is always vararg */
  luaX_next(&lexstate);  /* read first token */
  chunk(&lexstate);
  check(&lexstate, TK_EOS);
  close_func(&lexstate);
  lua_assert(funcstate.prev == NULL);
  lua_assert(funcstate.f->nups == 0);
  lua_assert(lexstate.fs == NULL);
  return funcstate.f;
}